

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

pair<const_std::pair<const_S,_bool>_*,_const_std::pair<const_S,_bool>_*> __thiscall
frozen::map<S,_bool,_4UL,_std::less<void>_>::equal_range<int>
          (map<S,_bool,_4UL,_std::less<void>_> *this,int *key)

{
  int iVar1;
  pair<const_S,_bool> *it;
  long lVar3;
  pair<const_std::pair<const_S,_bool>_*,_const_std::pair<const_S,_bool>_*> pVar4;
  pair<const_S,_bool> *ppVar2;
  
  iVar1 = *key;
  if ((this->items_).data_[1].first.x < iVar1) {
    lVar3 = 0x10;
    if ((this->items_).data_[2].first.x < iVar1) {
      lVar3 = (ulong)((this->items_).data_[3].first.x < iVar1) * 8 + 0x18;
    }
  }
  else {
    lVar3 = (ulong)((this->items_).data_[0].first.x < iVar1) << 3;
  }
  pVar4.first = (pair<const_S,_bool> *)((long)&(this->items_).data_[0].first.x + lVar3);
  ppVar2 = pVar4.first;
  if (lVar3 != 0x20) {
    ppVar2 = pVar4.first + (((pVar4.first)->first).x <= iVar1);
  }
  pVar4.second = ppVar2;
  return pVar4;
}

Assistant:

constexpr std::pair<const_iterator, const_iterator>
  equal_range(KeyType const &key) const {
    return equal_range_impl(*this, key);
  }